

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

pattern * makeTerminal(int type,int val)

{
  pattern *ppVar1;
  pattern *term;
  int val_local;
  int type_local;
  
  ppVar1 = (pattern *)malloc(0x28);
  if (ppVar1 == (pattern *)0x0) {
    halt("out of memory in makeTerminal()");
  }
  else {
    ppVar1->lhs = (patternType *)0x0;
    ppVar1->rhs = (patternType *)0x0;
    ppVar1->type = type;
    ppVar1->val = val;
    ppVar1->fvec[0] = 0.0;
    ppVar1->fvec[1] = 0.0;
    ppVar1->fvec[2] = 0.0;
    ppVar1->fvec[3] = 0.0;
  }
  return ppVar1;
}

Assistant:

pattern* makeTerminal(int type, int val) {
   pattern *term;
   term = (pattern *)malloc(sizeof(pattern));
   if (term) {
      term->lhs  = NULL;
      term->rhs  = NULL;
      term->type = type;
      term->val  = val;
      term->fvec[0] = 0.0;
      term->fvec[1] = 0.0;
      term->fvec[2] = 0.0;
      term->fvec[3] = 0.0;
   }
   else {
      halt("out of memory in makeTerminal()");
   }
   return term;
}